

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

error assemble_sched(context *ctx,token *token,opcode *op)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  long in_RCX;
  char *pcVar15;
  token_type type;
  optional *local_1f8;
  int local_1e0 [4];
  token local_1d0;
  uint local_1a8;
  byte local_1a1;
  uint32_t mask;
  token local_178;
  token local_150;
  uint local_124;
  _Optional_payload_base<unsigned_int> local_120;
  uint local_118;
  _Optional_payload_base<unsigned_int> local_114;
  byte local_109;
  token local_108;
  byte local_d9;
  undefined1 local_d8 [7];
  bool is_write;
  uint local_ac;
  _Optional_payload_base<unsigned_int> local_a8;
  uint local_a0;
  byte local_99;
  token local_98;
  token local_70;
  byte local_45;
  uint local_44;
  bool yield;
  _Optional_payload_base<unsigned_int> _Stack_40;
  uint32_t wait_barrier;
  optional<unsigned_int> read_barrier;
  optional<unsigned_int> write_barrier;
  optional<unsigned_int> stall;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  error *message;
  
  std::optional<unsigned_int>::optional(&write_barrier);
  std::optional<unsigned_int>::optional(&read_barrier);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)&stack0xffffffffffffffc0);
  local_44 = 0;
  local_45 = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        if (op[1].reuse != 0xc) {
          local_1e0[2] = 0;
          uVar14 = std::optional<unsigned_int>::value_or<int>(&write_barrier,local_1e0 + 2);
          local_1e0[3] = local_1e0[3] & 0xffffffe0U | uVar14 & 0xf |
                         (uint)((local_45 & 1) != 0) << 4;
          local_1e0[1] = 7;
          uVar14 = std::optional<unsigned_int>::value_or<int>(&read_barrier,local_1e0 + 1);
          local_1e0[3] = local_1e0[3] & 0xffffff1fU | (uVar14 & 7) << 5;
          local_1e0[0] = 7;
          uVar14 = std::optional<unsigned_int>::value_or<int>
                             ((optional<unsigned_int> *)&stack0xffffffffffffffc0,local_1e0);
          local_1e0[3] = local_1e0[3] & 0xffU | (uVar14 & 7) << 8 | (local_44 & 0x3f) << 0xb;
          *(int *)(in_RCX + 0xc) = local_1e0[3];
          memset(ctx,0,8);
          error::error((error *)ctx);
          return (unique_ptr<char[],_std::default_delete<char[]>_>)
                 (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
        }
        context::tokenize(&local_70,(context *)token);
        memcpy(op,&local_70,0x24);
        iVar13 = equal((token *)op,"WAIT");
        type = (token_type)op;
        if (iVar13 == 0) break;
        bVar12 = std::optional::operator_cast_to_bool((optional *)&write_barrier);
        if (bVar12) {
          fail((token *)ctx,(char *)op,"clocks to stall are already specified");
          return (unique_ptr<char[],_std::default_delete<char[]>_>)
                 (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
        }
        context::tokenize(&local_98,(context *)token);
        memcpy(op,&local_98,0x24);
        local_99 = 0;
        confirm_type((token *)ctx,type);
        bVar12 = error::operator_cast_to_bool((error *)ctx);
        if (bVar12) {
          local_99 = 1;
        }
        local_a0 = (uint)bVar12;
        if ((local_99 & 1) == 0) {
          error::~error((error *)ctx);
        }
        if (local_a0 != 0) {
          return (unique_ptr<char[],_std::default_delete<char[]>_>)
                 (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
        }
        lVar5._0_4_ = op->reuse;
        lVar5._4_4_ = op->sched;
        if ((lVar5 < 0) || (lVar6._0_4_ = op->reuse, lVar6._4_4_ = op->sched, 0xf < lVar6)) {
          fail((token *)ctx,(char *)op,
               "number of waited clocks must be between 0 and 15 inclusively");
          return (unique_ptr<char[],_std::default_delete<char[]>_>)
                 (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
        }
        uVar1 = op->reuse;
        local_ac = uVar1;
        std::optional<unsigned_int>::optional<unsigned_int,_true>
                  ((optional<unsigned_int> *)&local_a8,&local_ac);
        write_barrier.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (_Optional_base<unsigned_int,_true,_true>)
             (_Optional_base<unsigned_int,_true,_true>)local_a8;
        context::tokenize((token *)local_d8,(context *)token);
        memcpy(op,local_d8,0x24);
      }
      iVar13 = equal((token *)op,"WB");
      if ((iVar13 != 0) || (iVar13 = equal((token *)op,"RB"), iVar13 != 0)) break;
      iVar13 = equal((token *)op,"Y");
      if ((iVar13 == 0) && (iVar13 = equal((token *)op,"YIELD"), iVar13 == 0)) {
        iVar13 = equal((token *)op,"DEP");
        if (iVar13 == 0) {
          fail((token *)ctx,(char *)op,"expected @WAIT, @WB, @RB, @DEP, or @YIELD/@Y");
          return (unique_ptr<char[],_std::default_delete<char[]>_>)
                 (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
        }
        context::tokenize((token *)&mask,(context *)token);
        memcpy(op,&mask,0x24);
        local_1a1 = 0;
        confirm_type((token *)ctx,type);
        bVar12 = error::operator_cast_to_bool((error *)ctx);
        if (bVar12) {
          local_1a1 = 1;
        }
        local_a0 = (uint)bVar12;
        if ((local_1a1 & 1) == 0) {
          error::~error((error *)ctx);
        }
        if (local_a0 != 0) {
          return (unique_ptr<char[],_std::default_delete<char[]>_>)
                 (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
        }
        lVar9._0_4_ = op->reuse;
        lVar9._4_4_ = op->sched;
        if ((lVar9 < 0) || (lVar10._0_4_ = op->reuse, lVar10._4_4_ = op->sched, 5 < lVar10)) {
          fail((token *)ctx,(char *)op,
               "dependency barrier index must be between 0 and 5 inclusively");
          return (unique_ptr<char[],_std::default_delete<char[]>_>)
                 (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
        }
        uVar4 = op->reuse;
        local_1a8 = 1 << ((byte)uVar4 & 0x1f);
        if ((local_44 & local_1a8) != 0) {
          uVar11._0_4_ = op->reuse;
          uVar11._4_4_ = op->sched;
          fail((token *)ctx,(char *)op,"dependency barrier index %d already specified",
               uVar11 & 0xffffffff);
          return (unique_ptr<char[],_std::default_delete<char[]>_>)
                 (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
        }
        local_44 = local_1a8 | local_44;
        context::tokenize(&local_1d0,(context *)token);
        memcpy(op,&local_1d0,0x24);
      }
      else {
        if ((local_45 & 1) != 0) {
          fail((token *)ctx,(char *)op,"yield already specified");
          return (unique_ptr<char[],_std::default_delete<char[]>_>)
                 (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
        }
        local_45 = 1;
        context::tokenize(&local_178,(context *)token);
        memcpy(op,&local_178,0x24);
      }
    }
    iVar13 = equal((token *)op,"WB");
    local_d9 = iVar13 != 0;
    if ((bool)local_d9) {
      local_1f8 = (optional *)&read_barrier;
    }
    else {
      local_1f8 = (optional *)&stack0xffffffffffffffc0;
    }
    bVar12 = std::optional::operator_cast_to_bool(local_1f8);
    if (bVar12) {
      pcVar15 = "read";
      if ((local_d9 & 1) != 0) {
        pcVar15 = "write";
      }
      fail((token *)ctx,(char *)op,"%s barrier already specified",pcVar15);
      return (unique_ptr<char[],_std::default_delete<char[]>_>)
             (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
    }
    context::tokenize(&local_108,(context *)token);
    memcpy(op,&local_108,0x24);
    local_109 = 0;
    confirm_type((token *)ctx,type);
    bVar12 = error::operator_cast_to_bool((error *)ctx);
    if (bVar12) {
      local_109 = 1;
    }
    local_a0 = (uint)bVar12;
    if ((local_109 & 1) == 0) {
      error::~error((error *)ctx);
    }
    if (local_a0 != 0) break;
    lVar7._0_4_ = op->reuse;
    lVar7._4_4_ = op->sched;
    if ((lVar7 < 0) || (lVar8._0_4_ = op->reuse, lVar8._4_4_ = op->sched, 5 < lVar8)) {
      fail((token *)ctx,(char *)op,"barrier index must be between 0 and 5 inclusively");
      return (unique_ptr<char[],_std::default_delete<char[]>_>)
             (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
    }
    if ((local_d9 & 1) == 0) {
      uVar3 = op->reuse;
      local_124 = uVar3;
      std::optional<unsigned_int>::optional<unsigned_int,_true>
                ((optional<unsigned_int> *)&local_120,&local_124);
      _Stack_40 = local_120;
    }
    else {
      uVar2 = op->reuse;
      local_118 = uVar2;
      std::optional<unsigned_int>::optional<unsigned_int,_true>
                ((optional<unsigned_int> *)&local_114,&local_118);
      read_barrier.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> =
           (_Optional_base<unsigned_int,_true,_true>)
           (_Optional_base<unsigned_int,_true,_true>)local_114;
    }
    context::tokenize(&local_150,(context *)token);
    memcpy(op,&local_150,0x24);
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

static error assemble_sched(context& ctx, token& token, opcode& op)
{
    std::optional<uint32_t> stall;
    std::optional<uint32_t> write_barrier;
    std::optional<uint32_t> read_barrier;
    uint32_t wait_barrier = 0;
    bool yield = false;
    while (token.type == token_type::at) {
        token = ctx.tokenize();
        if (equal(token, "WAIT")) {
            if (stall) {
                return fail(token, "clocks to stall are already specified");
            }
            token = ctx.tokenize();
            if (error message = confirm_type(token, token_type::immediate); message) {
                return message;
            }
            if (token.data.immediate < 0 || token.data.immediate > 15) {
                return fail(token, "number of waited clocks must be between 0 and 15 inclusively");
            }
            stall = static_cast<uint32_t>(token.data.immediate);
            token = ctx.tokenize();
        } else if (equal(token, "WB") || equal(token, "RB")) {
            const bool is_write = equal(token, "WB");
            if (is_write ? write_barrier : read_barrier) {
                return fail(token, "%s barrier already specified", is_write ? "write" : "read");
            }
            token = ctx.tokenize();
            if (error message = confirm_type(token, token_type::immediate); message) {
                return message;
            }
            if (token.data.immediate < 0 || token.data.immediate > 5) {
                return fail(token, "barrier index must be between 0 and 5 inclusively");
            }
            if (is_write) {
                write_barrier = static_cast<uint32_t>(token.data.immediate);
            } else {
                read_barrier = static_cast<uint32_t>(token.data.immediate);
            }
            token = ctx.tokenize();
        } else if (equal(token, "Y") || equal(token, "YIELD")) {
            if (yield) {
                return fail(token, "yield already specified");
            }
            yield = true;
            token = ctx.tokenize();
        } else if (equal(token, "DEP")) {
            token = ctx.tokenize();
            if (error message = confirm_type(token, token_type::immediate); message) {
                return message;
            }
            if (token.data.immediate < 0 || token.data.immediate > 5) {
                return fail(token, "dependency barrier index must be between 0 and 5 inclusively");
            }
            const uint32_t mask = 1U << token.data.immediate;
            if (wait_barrier & mask) {
                return fail(token, "dependency barrier index %d already specified",
                            (int)token.data.immediate);
            }
            wait_barrier |= mask;
            token = ctx.tokenize();
        } else {
            return fail(token, "expected @WAIT, @WB, @RB, @DEP, or @YIELD/@Y");
        }
    }
    op.sched.values = {
        .stall = stall.value_or(0),
        .yield = yield ? 1U : 0U,
        .write_barrier = write_barrier.value_or(7),
        .read_barrier = read_barrier.value_or(7),
        .wait_barrier = wait_barrier,
        .padding = 0,
    };
    return {};
}